

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringExtraTest_InternalSwap_Test::TestBody
          (MicroStringExtraTest_InternalSwap_Test *this)

{
  string_view data;
  string_view data_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1a8;
  Message local_1a0;
  size_t local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_5;
  Message local_178;
  size_t local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  Message local_150;
  string_view local_148;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120;
  string_view local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  string_view local_e8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0 [3];
  Message local_a8;
  string_view local_a0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  size_t used_rhs;
  size_t used_lhs;
  size_t local_68;
  char *local_60;
  char *local_58;
  undefined1 local_50 [8];
  MicroStringExtra<15> rhs;
  MicroStringExtra<15> lhs;
  string_view rhs_value;
  string_view lhs_value;
  MicroStringExtraTest_InternalSwap_Test *this_local;
  
  rhs_value._M_str = (char *)0x5a;
  lhs.extra_buffer_[0] = '\x0f';
  lhs.extra_buffer_[1] = '\0';
  lhs.extra_buffer_[2] = '\0';
  lhs.extra_buffer_[3] = '\0';
  lhs.extra_buffer_[4] = '\0';
  lhs.extra_buffer_[5] = '\0';
  lhs.extra_buffer_[6] = '\0';
  lhs.extra_buffer_[7] = '\0';
  rhs_value._M_len = (size_t)anon_var_dwarf_8535a5;
  MicroStringExtraImpl<15UL>::MicroStringExtraImpl((MicroStringExtraImpl<15UL> *)rhs.extra_buffer_);
  MicroStringExtraImpl<15UL>::MicroStringExtraImpl((MicroStringExtraImpl<15UL> *)local_50);
  local_60 = rhs_value._M_str;
  local_58 = 
  "Very long string that is not SSO and unlikely to use the same capacity as the other value.";
  data_00._M_str =
       "Very long string that is not SSO and unlikely to use the same capacity as the other value.";
  data_00._M_len = (size_t)rhs_value._M_str;
  MicroStringExtraImpl<15UL>::Set
            ((MicroStringExtraImpl<15UL> *)rhs.extra_buffer_,data_00,(Arena *)0x0);
  used_lhs._0_1_ = lhs.extra_buffer_[0];
  used_lhs._1_1_ = lhs.extra_buffer_[1];
  used_lhs._2_1_ = lhs.extra_buffer_[2];
  used_lhs._3_1_ = lhs.extra_buffer_[3];
  used_lhs._4_1_ = lhs.extra_buffer_[4];
  used_lhs._5_1_ = lhs.extra_buffer_[5];
  used_lhs._6_1_ = lhs.extra_buffer_[6];
  used_lhs._7_1_ = lhs.extra_buffer_[7];
  local_68 = rhs_value._M_len;
  data._M_str = (char *)rhs_value._M_len;
  data._M_len._0_1_ = lhs.extra_buffer_[0];
  data._M_len._1_1_ = lhs.extra_buffer_[1];
  data._M_len._2_1_ = lhs.extra_buffer_[2];
  data._M_len._3_1_ = lhs.extra_buffer_[3];
  data._M_len._4_1_ = lhs.extra_buffer_[4];
  data._M_len._5_1_ = lhs.extra_buffer_[5];
  data._M_len._6_1_ = lhs.extra_buffer_[6];
  data._M_len._7_1_ = lhs.extra_buffer_[7];
  MicroStringExtraImpl<15UL>::Set((MicroStringExtraImpl<15UL> *)local_50,data,(Arena *)0x0);
  used_rhs = MicroString::SpaceUsedExcludingSelfLong((MicroString *)rhs.extra_buffer_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )MicroString::SpaceUsedExcludingSelfLong((MicroString *)local_50);
  local_a0 = MicroString::Get((MicroString *)rhs.extra_buffer_);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_90,"lhs.Get()","lhs_value",&local_a0,
             (basic_string_view<char,_std::char_traits<char>_> *)&rhs_value._M_str);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x3f3,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::Message::~Message(&local_a8);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_e8 = MicroString::Get((MicroString *)local_50);
    testing::internal::EqHelper::
    Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              ((EqHelper *)local_d8,"rhs.Get()","rhs_value",&local_e8,
               (basic_string_view<char,_std::char_traits<char>_> *)lhs.extra_buffer_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                 ,0x3f4,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_f0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      MicroStringExtraImpl<15UL>::InternalSwap
                ((MicroStringExtraImpl<15UL> *)rhs.extra_buffer_,
                 (MicroStringExtraImpl<15UL> *)local_50);
      local_118 = MicroString::Get((MicroString *)rhs.extra_buffer_);
      testing::internal::EqHelper::
      Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                ((EqHelper *)local_108,"lhs.Get()","rhs_value",&local_118,
                 (basic_string_view<char,_std::char_traits<char>_> *)lhs.extra_buffer_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3f8,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_120);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      local_148 = MicroString::Get((MicroString *)local_50);
      testing::internal::EqHelper::
      Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                ((EqHelper *)local_138,"rhs.Get()","lhs_value",&local_148,
                 (basic_string_view<char,_std::char_traits<char>_> *)&rhs_value._M_str);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3f9,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      local_170 = MicroString::SpaceUsedExcludingSelfLong((MicroString *)rhs.extra_buffer_);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_168,"used_rhs","lhs.SpaceUsedExcludingSelfLong()",
                 (unsigned_long *)&gtest_ar.message_,&local_170);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3fa,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_178);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_178);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      local_198 = MicroString::SpaceUsedExcludingSelfLong((MicroString *)local_50);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_190,"used_lhs","rhs.SpaceUsedExcludingSelfLong()",&used_rhs,
                 &local_198);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x3fb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      MicroString::Destroy((MicroString *)rhs.extra_buffer_);
      MicroString::Destroy((MicroString *)local_50);
    }
  }
  return;
}

Assistant:

TEST_F(MicroStringExtraTest, InternalSwap) {
  constexpr absl::string_view lhs_value =
      "Very long string that is not SSO and unlikely to use the same capacity "
      "as the other value.";
  constexpr absl::string_view rhs_value = "123456789012345";

  MicroStringExtra<15> lhs, rhs;
  lhs.Set(lhs_value, nullptr);
  rhs.Set(rhs_value, nullptr);

  const size_t used_lhs = lhs.SpaceUsedExcludingSelfLong();
  const size_t used_rhs = rhs.SpaceUsedExcludingSelfLong();

  // Verify setup.
  ASSERT_EQ(lhs.Get(), lhs_value);
  ASSERT_EQ(rhs.Get(), rhs_value);

  lhs.InternalSwap(&rhs);

  EXPECT_EQ(lhs.Get(), rhs_value);
  EXPECT_EQ(rhs.Get(), lhs_value);
  EXPECT_EQ(used_rhs, lhs.SpaceUsedExcludingSelfLong());
  EXPECT_EQ(used_lhs, rhs.SpaceUsedExcludingSelfLong());

  lhs.Destroy();
  rhs.Destroy();
}